

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int stat4ValueFromExpr(Parse *pParse,Expr *pExpr,u8 affinity,ValueNewStat4Ctx *pAlloc,
                      sqlite3_value **ppVal)

{
  u32 *puVar1;
  undefined2 uVar2;
  sqlite3 *db;
  Vdbe *pVVar3;
  int iVar4;
  sqlite3_value *psVar5;
  uint uVar6;
  ExprList_item *pEVar7;
  sqlite3_value *local_38;
  
  local_38 = (sqlite3_value *)0x0;
  db = pParse->db;
  if (pExpr != (Expr *)0x0) {
    do {
      if ((pExpr->flags >> 0xc & 1) == 0) {
        if ((pExpr->op == 0x94) && ((db->flags & 0x800000) == 0)) {
          uVar2 = pExpr->iColumn;
          uVar6 = 0x80000000;
          if ((short)uVar2 < 0x20) {
            uVar6 = 1 << ((char)uVar2 - 1U & 0x1f);
          }
          puVar1 = &pParse->pVdbe->expmask;
          *puVar1 = *puVar1 | uVar6;
          pVVar3 = pParse->pReprepare;
          if ((pVVar3 == (Vdbe *)0x0) ||
             (psVar5 = valueNew(db,pAlloc), psVar5 == (sqlite3_value *)0x0)) {
            local_38 = (sqlite3_value *)0x0;
            iVar4 = 0;
          }
          else {
            iVar4 = sqlite3VdbeMemCopy(psVar5,pVVar3->aVar + (long)(short)uVar2 + -1);
            applyAffinity(psVar5,affinity,db->enc);
            psVar5->db = pParse->db;
            local_38 = psVar5;
          }
        }
        else {
          iVar4 = valueFromExpr(db,pExpr,db->enc,affinity,&local_38,pAlloc);
        }
        goto LAB_001889a5;
      }
      if ((pExpr->flags >> 0x12 & 1) == 0) {
        pEVar7 = (ExprList_item *)&pExpr->pLeft;
      }
      else {
        pEVar7 = ((pExpr->x).pList)->a;
      }
      pExpr = pEVar7->pExpr;
    } while (pExpr != (Expr *)0x0);
  }
  psVar5 = valueNew(db,pAlloc);
  iVar4 = 0;
  if (psVar5 == (sqlite3_value *)0x0) {
    local_38 = (sqlite3_value *)0x0;
  }
  else if ((psVar5->flags & 0x2400) == 0) {
    psVar5->flags = 1;
    local_38 = psVar5;
  }
  else {
    vdbeMemClearExternAndSetNull(psVar5);
    local_38 = psVar5;
    iVar4 = 0;
  }
LAB_001889a5:
  *ppVal = local_38;
  return iVar4;
}

Assistant:

static int stat4ValueFromExpr(
  Parse *pParse,                  /* Parse context */
  Expr *pExpr,                    /* The expression to extract a value from */
  u8 affinity,                    /* Affinity to use */
  struct ValueNewStat4Ctx *pAlloc,/* How to allocate space.  Or NULL */
  sqlite3_value **ppVal           /* OUT: New value object (or NULL) */
){
  int rc = SQLITE_OK;
  sqlite3_value *pVal = 0;
  sqlite3 *db = pParse->db;

  /* Skip over any TK_COLLATE nodes */
  pExpr = sqlite3ExprSkipCollate(pExpr);

  assert( pExpr==0 || pExpr->op!=TK_REGISTER || pExpr->op2!=TK_VARIABLE );
  if( !pExpr ){
    pVal = valueNew(db, pAlloc);
    if( pVal ){
      sqlite3VdbeMemSetNull((Mem*)pVal);
    }
  }else if( pExpr->op==TK_VARIABLE && (db->flags & SQLITE_EnableQPSG)==0 ){
    Vdbe *v;
    int iBindVar = pExpr->iColumn;
    sqlite3VdbeSetVarmask(pParse->pVdbe, iBindVar);
    if( (v = pParse->pReprepare)!=0 ){
      pVal = valueNew(db, pAlloc);
      if( pVal ){
        rc = sqlite3VdbeMemCopy((Mem*)pVal, &v->aVar[iBindVar-1]);
        sqlite3ValueApplyAffinity(pVal, affinity, ENC(db));
        pVal->db = pParse->db;
      }
    }
  }else{
    rc = valueFromExpr(db, pExpr, ENC(db), affinity, &pVal, pAlloc);
  }

  assert( pVal==0 || pVal->db==db );
  *ppVal = pVal;
  return rc;
}